

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall kratos::Generator::remove_stmt(Generator *this,shared_ptr<kratos::Stmt> *stmt)

{
  __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
  __position;
  
  if (this->use_stmts_remove_cache_ == true) {
    std::
    _Hashtable<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Stmt>>,std::hash<std::shared_ptr<kratos::Stmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<std::shared_ptr<kratos::Stmt>const&>
              ((_Hashtable<std::shared_ptr<kratos::Stmt>,std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Stmt>>,std::hash<std::shared_ptr<kratos::Stmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->stmts_remove_cache_,stmt);
    return;
  }
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::Stmt>*,std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<kratos::Stmt>const>>
                         ((this->stmts_).
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->stmts_).
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  if (__position._M_current !=
      (this->stmts_).
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    _M_erase(&this->stmts_,(iterator)__position._M_current);
    return;
  }
  return;
}

Assistant:

void Generator::remove_stmt(const std::shared_ptr<Stmt> &stmt) {
    if (use_stmts_remove_cache_) {
        stmts_remove_cache_.emplace(stmt);
        return;
    }
    auto pos = std::find(stmts_.begin(), stmts_.end(), stmt);
    if (pos != stmts_.end()) {
        stmts_.erase(pos);
    }
}